

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O3

int CECoordinates::Observed2ICRS
              (double az,double zen,double *ra,double *dec,double julian_date,double longitude,
              double latitude,double elevation_m,double pressure_hPa,double temperature_celsius,
              double relative_humidity,double dut1,double xp,double yp,double wavelength_um)

{
  double input_ra;
  double input_dec;
  int iVar1;
  CEAngleType local_64;
  CEDate local_60;
  
  iVar1 = Observed2CIRS(az,zen,ra,dec,julian_date,longitude,latitude,elevation_m,pressure_hPa,
                        temperature_celsius,relative_humidity,dut1,xp,yp,wavelength_um);
  if (iVar1 == 0) {
    input_ra = *ra;
    input_dec = *dec;
    CEDate::CEDate(&local_60,julian_date,JD);
    local_64 = RADIANS;
    CIRS2ICRS(input_ra,input_dec,ra,dec,&local_60,&local_64);
    CEDate::~CEDate(&local_60);
  }
  return iVar1;
}

Assistant:

int CECoordinates::Observed2ICRS(double az, double zen,
                                 double *ra, double *dec,
                                 double julian_date,
                                 double longitude,
                                 double latitude,
                                 double elevation_m,
                                 double pressure_hPa,
                                 double temperature_celsius,
                                 double relative_humidity,
                                 double dut1,
                                 double xp, double yp,
                                 double wavelength_um)
{
    // Convert from Observed -> CIRS
    int err_code = Observed2CIRS(az, zen,
                                 ra, dec,
                                 julian_date,
                                 longitude, latitude,
                                 elevation_m, pressure_hPa,
                                 temperature_celsius, relative_humidity,
                                 dut1, xp, yp, wavelength_um) ;
    if (err_code == 0) {
        // Convert from CIRS -> ICRS
        CIRS2ICRS(*ra, *dec, ra, dec,
                  CEDate(julian_date,CEDateType::JD),
                  CEAngleType::RADIANS) ;
    }
    
    return err_code ;
}